

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::run(LegalizeJSInterface *this,Module *module)

{
  undefined8 *puVar1;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  PassRunner *pPVar2;
  uintptr_t uVar3;
  pointer puVar4;
  pointer puVar5;
  Global *pGVar6;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> *p_Var7;
  pointer puVar8;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var9;
  _Alloc_hider _Var10;
  pointer puVar11;
  pointer pTVar12;
  pointer ppFVar13;
  LegalizeJSInterface *pLVar14;
  char cVar15;
  bool bVar16;
  Index IVar17;
  Function *pFVar18;
  long *plVar19;
  Function *pFVar20;
  Block *value;
  size_t sVar21;
  Type *pTVar22;
  Expression *pEVar23;
  Block *this_01;
  LocalSet *item;
  Export *pEVar24;
  Function *pFVar25;
  Call *pCVar26;
  undefined8 *puVar27;
  Function **ppFVar28;
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  *this_02;
  Module *pMVar29;
  mapped_type __s;
  mapped_type *ppFVar30;
  variant<wasm::Name,_wasm::HeapType> *pvVar31;
  char *pcVar32;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  undefined1 auVar33 [8];
  __node_base _Var34;
  __node_base *p_Var35;
  _func_int **pp_Var36;
  _Head_base<0UL,_wasm::Function_*,_false> _Var37;
  Type TVar38;
  Type in_R9;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> *p_Var39;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  *pvVar40;
  HeapType *pHVar41;
  Type TVar42;
  MixedArena *pMVar43;
  ExpressionList *this_03;
  pointer ppFVar44;
  pointer puVar45;
  pointer puVar46;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar47;
  Name name;
  Name name_00;
  initializer_list<wasm::Expression_*> __l;
  optional<wasm::Type> type_;
  string_view sVar48;
  string_view s;
  string_view s_00;
  Name name_01;
  Name name_02;
  Signature sig;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  string_view sVar49;
  Signature SVar50;
  undefined1 auStack_268 [8];
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  newExports;
  undefined1 auStack_248 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> legalParams;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [3];
  bool local_1f8;
  undefined1 local_1f0 [200];
  Function *pFStack_128;
  _Storage<wasm::Function::DebugLocation,_true> local_120;
  Type local_108;
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  *local_100;
  __node_base _Stack_f8;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> originalFunctions;
  _Head_base<0UL,_wasm::Function_*,_false> local_b0;
  LegalizeJSInterface *local_a8;
  Function *local_a0;
  Type local_98;
  Builder builder_1;
  Type local_88;
  Builder builder;
  undefined1 local_78 [32];
  _Head_base<0UL,_wasm::Export_*,_false> _Stack_58;
  size_type __dnew;
  undefined6 local_48;
  undefined2 uStack_42;
  undefined4 local_40;
  undefined1 local_3c;
  
  this->getTempRet0 = (Function *)0x0;
  this->setTempRet0 = (Function *)0x0;
  auStack_248 = (undefined1  [8])
                &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  _Stack_58._M_head_impl = (Export *)0x26;
  auStack_248 = (undefined1  [8])
                std::__cxx11::string::_M_create
                          ((ulong *)auStack_248,(ulong)&stack0xffffffffffffffa8);
  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_Stack_58._M_head_impl;
  builtin_strncpy((char *)auStack_248,"legalize-js-interface-export-originals",0x26);
  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)_Stack_58._M_head_impl;
  *(char *)((long)auStack_248 + (long)_Stack_58._M_head_impl) = '\0';
  local_a8 = this;
  cVar15 = Pass::hasArgument(&this->super_Pass,(string *)auStack_248);
  if (auStack_248 !=
      (undefined1  [8])
      &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_248,
                    (ulong)((long)&(legalParams.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  auStack_248 = (undefined1  [8])
                &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  _Stack_58._M_head_impl = (Export *)0x26;
  auStack_248 = (undefined1  [8])
                std::__cxx11::string::_M_create
                          ((ulong *)auStack_248,(ulong)&stack0xffffffffffffffa8);
  pLVar14 = local_a8;
  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_Stack_58._M_head_impl;
  (((Function *)auStack_248)->super_Importable).super_Named.hasExplicitName = true;
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x11 = 'f';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x12 = 'a';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x13 = 'c';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x14 = 'e';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x15 = '-';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x16 = 'e';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x17 = 'x';
  (((Function *)auStack_248)->super_Importable).module.super_IString.str._M_len = 0x682d646574726f70
  ;
  (((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str._M_len =
       0x657a696c6167656c;
  (((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str._M_str =
       (char *)0x65746e692d736a2d;
  *(undefined8 *)
   ((long)&(((Function *)auStack_248)->super_Importable).module.super_IString.str._M_len + 6) =
       0x737265706c65682d;
  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)_Stack_58._M_head_impl;
  *(string *)
   ((long)&(((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str._M_len +
   (long)_Stack_58._M_head_impl) = (string)0x0;
  bVar16 = Pass::hasArgument(&local_a8->super_Pass,(string *)auStack_248);
  pLVar14->exportedHelpers = bVar16;
  if (auStack_248 !=
      (undefined1  [8])
      &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_248,
                    (ulong)((long)&(legalParams.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  auStack_268 = (undefined1  [8])0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar20 = (Function *)
            (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_78._24_8_ = module;
  if (pFVar20 !=
      (Function *)
      originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    newExports.
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&module->allocator;
    local_78[0x17] = cVar15;
    do {
      pPVar2 = (PassRunner *)((Pass *)&pFVar20->super_Importable)->_vptr_Pass;
      local_a0 = pFVar20;
      if (*(int *)&pPVar2->allocator == 0) {
        pvVar40 = &pPVar2->passes;
        if (*(char *)&(pPVar2->passes).
                      super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != '\0') {
          pvVar40 = (vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                     *)0x0;
        }
        pFVar20 = (Function *)
                  (pvVar40->
                  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pFVar18 = Module::getFunction(module,(IString)*(IString *)
                                                       &(pvVar40->
                                                                                                                
                                                  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                                                  )._M_impl.super__Vector_impl_data);
        bVar16 = isIllegal<wasm::Function>((LegalizeJSInterface *)pFVar18,pFVar20);
        if (bVar16) {
          _local_48 = (Function *)0x7574736c6167656c;
          __dnew = 10;
          local_40 = CONCAT13(local_40._3_1_,0x2462);
          pcVar32 = (pFVar18->super_Importable).super_Named.name.super_IString.str._M_str;
          local_88.id = (uintptr_t)local_78;
          _Stack_58._M_head_impl = (Export *)&stack0xffffffffffffffb8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,pcVar32,
                     pcVar32 + (pFVar18->super_Importable).super_Named.name.super_IString.str._M_len
                    );
          _Var37._M_head_impl = (Function *)0xf;
          if (_Stack_58._M_head_impl != (Export *)&stack0xffffffffffffffb8) {
            _Var37._M_head_impl = _local_48;
          }
          pFVar20 = (Function *)
                    ((long)&((builder.wasm)->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + __dnew);
          TVar38.id = __dnew;
          local_100 = pvVar40;
          if (_Var37._M_head_impl < pFVar20) {
            pFVar25 = (Function *)0xf;
            if ((Module *)local_88.id != (Module *)local_78) {
              pFVar25 = (Function *)local_78._0_8_;
            }
            if (pFVar25 < pFVar20) goto LAB_00919fad;
            plVar19 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_88,0,(char *)0x0,
                                         (ulong)_Stack_58._M_head_impl);
          }
          else {
LAB_00919fad:
            plVar19 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&stack0xffffffffffffffa8,local_88.id);
          }
          auStack_248 = (undefined1  [8])
                        &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          pFVar20 = (Function *)(plVar19 + 2);
          if ((Function *)*plVar19 == pFVar20) {
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)(pFVar20->super_Importable).super_Named.name.super_IString.str._M_len;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)plVar19[3];
          }
          else {
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)(pFVar20->super_Importable).super_Named.name.super_IString.str._M_len;
            auStack_248 = (undefined1  [8])*plVar19;
          }
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)plVar19[1];
          *plVar19 = (long)pFVar20;
          plVar19[1] = 0;
          *(undefined1 *)&(pFVar20->super_Importable).super_Named.name.super_IString.str._M_len = 0;
          sVar49._M_str = (char *)0x0;
          sVar49._M_len = (size_t)auStack_248;
          sVar49 = IString::interned((IString *)
                                     legalParams.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start,sVar49,
                                     SUB81(pFVar20,0));
          if (auStack_248 !=
              (undefined1  [8])
              &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete((void *)auStack_248,
                            (ulong)((long)&(legalParams.
                                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
          }
          if ((Module *)local_88.id != (Module *)local_78) {
            operator_delete((void *)local_88.id,
                            (ulong)((long)&(((Importable *)local_78._0_8_)->super_Named).name.
                                           super_IString.str._M_len + 1));
          }
          if (_Stack_58._M_head_impl != (Export *)&stack0xffffffffffffffb8) {
            operator_delete(_Stack_58._M_head_impl,(ulong)((long)_local_48 + 1));
          }
          pFVar20 = Module::getFunctionOrNull((Module *)local_78._24_8_,(Name)sVar49);
          if (pFVar20 == (Function *)0x0) {
            local_88.id = local_78._24_8_;
            pFVar20 = (Function *)operator_new(0x1d8);
            memset(pFVar20,0,0x1d8);
            HeapType::HeapType(&pFVar20->type,(Signature)ZEXT816(0));
            pFVar20->profile = Normal;
            (pFVar20->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar20->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pFVar20->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pFVar20->body = (Expression *)0x0;
            (pFVar20->localNames)._M_h._M_buckets = &(pFVar20->localNames)._M_h._M_single_bucket;
            (pFVar20->localNames)._M_h._M_bucket_count = 1;
            (pFVar20->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            (pFVar20->localNames)._M_h._M_element_count = 0;
            (pFVar20->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            (pFVar20->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
            (pFVar20->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (pFVar20->localIndices)._M_h._M_buckets = &(pFVar20->localIndices)._M_h._M_single_bucket
            ;
            (pFVar20->localIndices)._M_h._M_bucket_count = 1;
            (pFVar20->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            (pFVar20->localIndices)._M_h._M_element_count = 0;
            (pFVar20->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            (pFVar20->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
            (pFVar20->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (pFVar20->debugLocations)._M_h._M_buckets =
                 &(pFVar20->debugLocations)._M_h._M_single_bucket;
            (pFVar20->debugLocations)._M_h._M_bucket_count = 1;
            (pFVar20->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            (pFVar20->debugLocations)._M_h._M_element_count = 0;
            (pFVar20->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            (pFVar20->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
            (pFVar20->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (pFVar20->prologLocation).
            super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
            (pFVar20->epilogLocation).
            super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
            (pFVar20->expressionLocations)._M_h._M_buckets =
                 &(pFVar20->expressionLocations)._M_h._M_single_bucket;
            (pFVar20->expressionLocations)._M_h._M_bucket_count = 1;
            (pFVar20->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            (pFVar20->expressionLocations)._M_h._M_element_count = 0;
            (pFVar20->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            (pFVar20->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
            (pFVar20->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (pFVar20->delimiterLocations)._M_h._M_buckets =
                 &(pFVar20->delimiterLocations)._M_h._M_single_bucket;
            (pFVar20->delimiterLocations)._M_h._M_bucket_count = 1;
            (pFVar20->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            (pFVar20->delimiterLocations)._M_h._M_element_count = 0;
            (pFVar20->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            *(undefined8 *)((long)&(pFVar20->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
            (pFVar20->funcLocation).declarations = 0;
            (pFVar20->funcLocation).end = 0;
            (pFVar20->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
            (pFVar20->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (pFVar20->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            (pFVar20->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pFVar20->noFullInline = false;
            pFVar20->noPartialInline = false;
            (pFVar20->super_Importable).super_Named.name.super_IString.str = sVar49;
            (pFVar20->super_Importable).super_Named.hasExplicitName = true;
            value = (Block *)MixedArena::allocSpace
                                       ((MixedArena *)
                                        newExports.
                                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0x48,8);
            (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = CallId
            ;
            (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
            (value->name).super_IString.str._M_len = 0;
            (value->name).super_IString.str._M_str = (char *)0x0;
            (value->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .data = (Expression **)0x0;
            (value->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .usedElements =
                 (size_t)newExports.
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (value->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .allocatedElements = 0;
            (value->list).allocator = (MixedArena *)0x0;
            value[1].super_SpecificExpression<(wasm::Expression::Id)1>.super_Expression._id =
                 InvalidId;
            pMVar43 = (MixedArena *)
                      (pFVar18->super_Importable).super_Named.name.super_IString.str._M_str;
            (value->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .allocatedElements =
                 (pFVar18->super_Importable).super_Named.name.super_IString.str._M_len;
            (value->list).allocator = pMVar43;
            pHVar41 = &pFVar18->type;
            SVar50 = HeapType::getSignature(pHVar41);
            (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
                 SVar50.results.id.id;
            auStack_248 = (undefined1  [8])0x0;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            SVar50 = HeapType::getSignature(pHVar41);
            _Stack_f8._M_nxt = (_Hash_node_base *)SVar50.params.id;
            __dnew = 0;
            _Stack_58._M_head_impl = (Export *)&_Stack_f8;
            sVar21 = wasm::Type::size((Type *)&_Stack_f8);
            if ((__dnew != sVar21) || (_Stack_58._M_head_impl != (Export *)&_Stack_f8)) {
              do {
                pTVar22 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffa8);
                pTVar12 = legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                auVar33 = auStack_248;
                uVar3 = pTVar22->id;
                if (uVar3 == 3) {
                  IVar17 = (Index)((ulong)((long)legalParams.
                                                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                                 ._M_impl.super__Vector_impl_data._M_start -
                                          (long)auStack_248) >> 3);
                  pEVar23 = I64Utilities::recreateI64((Builder *)&local_88,IVar17,IVar17 + 1);
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&value->name,pEVar23);
                  local_98.id = 2;
                  if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::
                    _M_realloc_insert<wasm::Type>
                              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_248,
                               (iterator)
                               legalParams.
                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                               super__Vector_impl_data._M_start,&local_98);
                  }
                  else {
                    (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start)->id = 2;
                    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1;
                  }
                  local_98.id = 2;
                  if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::
                    _M_realloc_insert<wasm::Type>
                              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_248,
                               (iterator)
                               legalParams.
                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                               super__Vector_impl_data._M_start,&local_98);
                  }
                  else {
                    (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start)->id = 2;
LAB_0091a3cc:
                    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1;
                  }
                }
                else {
                  pEVar23 = (Expression *)
                            MixedArena::allocSpace((MixedArena *)(local_88.id + 0x200),0x18,8);
                  pEVar23->_id = LocalGetId;
                  *(int *)(pEVar23 + 1) = (int)((ulong)((long)pTVar12 - (long)auVar33) >> 3);
                  (pEVar23->type).id = uVar3;
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&value->name,pEVar23);
                  if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start)->id = pTVar22->id;
                    goto LAB_0091a3cc;
                  }
                  std::vector<wasm::Type,std::allocator<wasm::Type>>::
                  _M_realloc_insert<wasm::Type_const&>
                            ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_248,
                             (iterator)
                             legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_start,pTVar22);
                }
                __dnew = __dnew + 1;
              } while ((__dnew != sVar21) || (_Stack_58._M_head_impl != (Export *)&_Stack_f8));
            }
            SVar50 = HeapType::getSignature(pHVar41);
            TVar42.id = 2;
            if (SVar50.results.id.id != 3) {
              SVar50 = HeapType::getSignature(pHVar41);
              TVar42 = SVar50.results.id;
            }
            wasm::Type::Type((Type *)&_Stack_f8,(Tuple *)auStack_248);
            SVar50.results.id = TVar42.id;
            SVar50.params.id = (uintptr_t)_Stack_f8._M_nxt;
            HeapType::HeapType((HeapType *)&stack0xffffffffffffffa8,SVar50);
            (pFVar20->type).id = (uintptr_t)_Stack_58._M_head_impl;
            SVar50 = HeapType::getSignature(pHVar41);
            this_01 = value;
            if (SVar50.results.id.id == 3) {
              IVar17 = Builder::addVar((Builder *)pFVar20,(Function *)0x0,(Name)(ZEXT816(3) << 0x40)
                                       ,TVar38);
              pMVar43 = (MixedArena *)(local_88.id + 0x200);
              this_01 = (Block *)MixedArena::allocSpace(pMVar43,0x40,8);
              (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id =
                   BlockId;
              (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
                   = 0;
              (this_01->name).super_IString.str._M_len = 0;
              (this_01->name).super_IString.str._M_str = (char *)0x0;
              (this_01->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
                   (Expression **)0x0;
              (this_01->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements = 0;
              (this_01->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              allocatedElements = 0;
              (this_01->list).allocator = pMVar43;
              item = Builder::makeLocalSet((Builder *)&local_88,IVar17,(Expression *)value);
              this_03 = &this_01->list;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&this_03->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(Expression *)item);
              pFVar25 = local_a8->setTempRet0;
              if (pFVar25 == (Function *)0x0) {
                if (local_a8->exportedHelpers == true) {
                  name.super_IString.str._M_str = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_EXPORTE_1;
                  name.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_EXPORTE_0;
                  pEVar24 = Module::getExport((Module *)local_78._24_8_,name);
                  pcVar32 = (char *)0x0;
                  sVar21 = 0;
                  if (pEVar24->kind == Function) {
                    pvVar31 = &pEVar24->value;
                    if (*(__index_type *)
                         ((long)&(pEVar24->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) !=
                        '\0') {
                      pvVar31 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
                    }
                    sVar21 = *(size_t *)
                              &(pvVar31->super__Variant_base<wasm::Name,_wasm::HeapType>).
                               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
                    pcVar32 = *(char **)((long)&(pvVar31->
                                                super__Variant_base<wasm::Name,_wasm::HeapType>).
                                                super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                .
                                                super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                                                .super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                                super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                                super__Variant_storage_alias<wasm::Name,_wasm::HeapType>
                                                ._M_u + 8);
                  }
                  name_00.super_IString.str._M_str = pcVar32;
                  name_00.super_IString.str._M_len = sVar21;
                  pFVar25 = Module::getFunction((Module *)local_78._24_8_,name_00);
                }
                else {
                  name_05.super_IString.str._M_str = (char *)0x2;
                  name_05.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_IMPORTE_1;
                  pFVar25 = getFunctionOrImport((LegalizeJSInterface *)local_78._24_8_,
                                                _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_IMPORTE_0,
                                                name_05,(Type)0x0,in_R9);
                }
                local_a8->setTempRet0 = pFVar25;
              }
              sVar49 = (pFVar25->super_Importable).super_Named.name.super_IString.str;
              local_98.id = (uintptr_t)I64Utilities::getI64High((Builder *)&local_88,IVar17);
              __l._M_len = 1;
              __l._M_array = (iterator)&local_98;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &stack0xffffffffffffffa8,__l,(allocator_type *)&builder_1);
              in_R9.id = 0;
              pCVar26 = Builder::makeCall((Builder *)&local_88,(Name)sVar49,
                                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                           *)&stack0xffffffffffffffa8,(Type)0x0,false);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&this_03->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(Expression *)pCVar26);
              if (_Stack_58._M_head_impl != (Export *)0x0) {
                operator_delete(_Stack_58._M_head_impl,
                                (long)_local_48 - (long)_Stack_58._M_head_impl);
              }
              pEVar23 = I64Utilities::getI64Low((Builder *)&local_88,IVar17);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&this_03->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,pEVar23);
              type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)pEVar23;
              Block::finalize(this_01,type_,Unknown);
            }
            pFVar20->body = (Expression *)this_01;
            pFVar20 = Module::addFunction((Module *)local_78._24_8_,pFVar20);
            cVar15 = local_78[0x17];
            sVar48 = (pFVar20->super_Importable).super_Named.name.super_IString.str;
            sVar49 = (pFVar20->super_Importable).super_Named.name.super_IString.str;
            if (auStack_248 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_248,
                              (long)legalParams.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)auStack_248);
              sVar49 = sVar48;
            }
          }
          (local_100->
          super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)sVar49._M_len;
          (local_100->
          super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar49._M_str;
          module = (Module *)local_78._24_8_;
          if ((cVar15 != '\0') &&
             ((pFVar18->super_Importable).module.super_IString.str._M_str == (char *)0x0)) {
            pPVar2 = (PassRunner *)((Pass *)&local_a0->super_Importable)->_vptr_Pass;
            auStack_248 = (undefined1  [8])pPVar2->_vptr_PassRunner;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pPVar2->wasm;
            bVar16 = IString::startsWith<9>((IString *)auStack_248,(char (*) [9])"dynCall_");
            module = (Module *)local_78._24_8_;
            if (!bVar16) {
              __dnew = 5;
              local_48 = 0x246769726f;
              pPVar2 = (PassRunner *)((Pass *)&local_a0->super_Importable)->_vptr_Pass;
              pMVar29 = pPVar2->wasm;
              local_88.id = (uintptr_t)local_78;
              _Stack_58._M_head_impl = (Export *)&stack0xffffffffffffffb8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_88,pMVar29,
                         (long)&(pMVar29->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                         (long)pPVar2->_vptr_PassRunner);
              _Var37._M_head_impl = (Function *)0xf;
              if (_Stack_58._M_head_impl != (Export *)&stack0xffffffffffffffb8) {
                _Var37._M_head_impl = _local_48;
              }
              pFVar20 = (Function *)
                        ((long)&((builder.wasm)->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + __dnew);
              if (_Var37._M_head_impl < pFVar20) {
                pFVar25 = (Function *)0xf;
                if ((Module *)local_88.id != (Module *)local_78) {
                  pFVar25 = (Function *)local_78._0_8_;
                }
                if (pFVar25 < pFVar20) goto LAB_0091a770;
                puVar27 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_88,0,(char *)0x0,(ulong)_Stack_58._M_head_impl);
              }
              else {
LAB_0091a770:
                puVar27 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&stack0xffffffffffffffa8,local_88.id);
              }
              auStack_248 = (undefined1  [8])
                            &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
              puVar1 = puVar27 + 2;
              if ((pointer *)*puVar27 == (pointer *)puVar1) {
                legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)*puVar1;
                legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)puVar27[3];
              }
              else {
                legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)*puVar1;
                auStack_248 = (undefined1  [8])*puVar27;
              }
              legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)puVar27[1];
              *puVar27 = puVar1;
              puVar27[1] = 0;
              *(undefined1 *)puVar1 = 0;
              sVar48._M_str = (char *)0x0;
              sVar48._M_len = (size_t)auStack_248;
              sVar49 = IString::interned((IString *)
                                         legalParams.
                                         super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_start,sVar48,
                                         SUB81(puVar1,0));
              if (auStack_248 !=
                  (undefined1  [8])
                  &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete((void *)auStack_248,
                                (ulong)((long)&(legalParams.
                                                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)->id + 1)
                               );
              }
              if ((Module *)local_88.id != (Module *)local_78) {
                operator_delete((void *)local_88.id,
                                (ulong)((long)&(((Importable *)local_78._0_8_)->super_Named).name.
                                               super_IString.str._M_len + 1));
              }
              if (_Stack_58._M_head_impl != (Export *)&stack0xffffffffffffffb8) {
                operator_delete(_Stack_58._M_head_impl,(ulong)((long)_local_48 + 1));
              }
              auStack_248 = (undefined1  [8])
                            (pFVar18->super_Importable).super_Named.name.super_IString.str._M_len;
              legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)(pFVar18->super_Importable).super_Named.name.super_IString.str._M_str;
              _Stack_58._M_head_impl = (Export *)operator_new(0x30);
              *(undefined1 (*) [8])((long)_Stack_58._M_head_impl + 0x18) = auStack_248;
              ((string_view *)((long)_Stack_58._M_head_impl + 0x20))->_M_len =
                   (size_t)legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              *(string_view *)_Stack_58._M_head_impl = sVar49;
              *(undefined4 *)&((string_view *)((long)_Stack_58._M_head_impl + 0x10))->_M_len = 0;
              *(string *)((long)_Stack_58._M_head_impl + 0x28) = (string)0x0;
              std::
              vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>
              ::emplace_back<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>
                        ((vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>
                          *)auStack_268,
                         (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                         &stack0xffffffffffffffa8);
              module = (Module *)local_78._24_8_;
              if ((_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)
                  _Stack_58._M_head_impl != (Export *)0x0) {
                operator_delete(_Stack_58._M_head_impl,0x30);
              }
            }
          }
        }
      }
      puVar11 = newExports.
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar20 = (Function *)&((Pass *)&local_a0->super_Importable)->runner;
      auVar33 = auStack_268;
    } while (pFVar20 !=
             (Function *)
             originalFunctions.
             super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
    for (; auVar33 != (undefined1  [8])puVar11; auVar33 = (undefined1  [8])((long)auVar33 + 8)) {
      Module::addExport((Module *)local_78._24_8_,
                        (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auVar33);
    }
  }
  _Stack_f8._M_nxt = (_Hash_node_base *)0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar47 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)(local_78._24_8_ + 0x18))->
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              *)(local_78._24_8_ + 0x18))->
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pMVar29 = (Module *)local_78._24_8_;
  if (puVar47 != puVar4) {
    ppFVar28 = &local_a8->getTempRet0;
    do {
      auStack_248 = (undefined1  [8])
                    (puVar47->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pFVar20 = (Function *)auStack_248;
      std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
                ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&_Stack_f8,
                 (Function **)auStack_248);
      ppFVar13 = originalFunctions.
                 super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar4);
    pMVar29 = (Module *)local_78._24_8_;
    if (_Stack_f8._M_nxt !=
        (_Hash_node_base *)
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pMVar43 = (MixedArena *)(local_78._24_8_ + 0x200);
      this_02 = &local_a8->illegalImportsToLegal;
      _Var34._M_nxt = _Stack_f8._M_nxt;
      do {
        local_a0 = (Function *)
                   (((vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                      *)_Var34._M_nxt)->
                   super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        if (((((Pass *)&local_a0->super_Importable)->name).field_2._M_allocated_capacity != 0) &&
           (bVar16 = isIllegal<wasm::Function>((LegalizeJSInterface *)local_a0,pFVar20), bVar16)) {
          local_100 = (vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                       *)_Var34._M_nxt;
          local_98.id = (uintptr_t)pMVar29;
          pMVar29 = (Module *)operator_new(0x1d8);
          memset(pMVar29,0,0x1d8);
          HeapType::HeapType((HeapType *)
                             &(pMVar29->globals).
                              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,(Signature)ZEXT816(0));
          pFVar20 = local_a0;
          *(undefined4 *)
           &(pMVar29->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
          (pMVar29->tags).
          super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pMVar29->tags).
          super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pMVar29->tags).
          super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pMVar29->elementSegments).
          super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pMVar29->elementSegments).
          super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)&(pMVar29->dataSegments).
                         super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          (pMVar29->elementSegments).
          super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
          (pMVar29->memories).
          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pMVar29->memories).
          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined4 *)
           &(pMVar29->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = 0x3f800000;
          (pMVar29->dataSegments).
          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pMVar29->dataSegments).
          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pMVar29->dataSegments).
          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pMVar29->customSections;
          (pMVar29->tables).
          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
          (pMVar29->tables).
          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pMVar29->tables).
          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(undefined4 *)&(pMVar29->start).super_IString.str._M_len = 0x3f800000;
          (pMVar29->start).super_IString.str._M_str = (char *)0x0;
          (pMVar29->customSections).
          super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pMVar29->customSections).
          super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&pMVar29->debugInfoSymbolNames;
          (pMVar29->customSections).
          super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
          (pMVar29->dylinkSection)._M_t.
          super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t
          .super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
          super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl = (DylinkSection *)0x0;
          (pMVar29->debugInfoFileNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(undefined4 *)
           &(pMVar29->debugInfoFileNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = 0x3f800000;
          (pMVar29->debugInfoFileNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pMVar29->debugInfoSymbolNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(undefined1 *)((long)&(pMVar29->debugInfoSourceRoot)._M_dataplus._M_p + 4) = 0;
          (pMVar29->debugInfoSourceRoot).field_2._M_local_buf[0xc] = '\0';
          (pMVar29->debugInfoFile)._M_dataplus._M_p =
               (pointer)&(pMVar29->debugInfoSourcesContent).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pMVar29->debugInfoFile)._M_string_length = 1;
          (pMVar29->debugInfoFile).field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar29->debugInfoFile).field_2 + 8) = 0;
          *(undefined4 *)
           &(pMVar29->debugInfoSourcesContent).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = 0x3f800000;
          (pMVar29->debugInfoSourcesContent).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pMVar29->debugInfoSourcesContent).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(size_type **)&pMVar29->features = &(pMVar29->typeNames)._M_h._M_element_count;
          (pMVar29->name).super_IString.str._M_len = 1;
          (pMVar29->name).super_IString.str._M_str = (char *)0x0;
          (pMVar29->typeNames)._M_h._M_buckets = (__buckets_ptr)0x0;
          *(undefined4 *)&(pMVar29->typeNames)._M_h._M_bucket_count = 0x3f800000;
          *(undefined8 *)((long)&(pMVar29->typeNames)._M_h._M_element_count + 4) = 0;
          *(undefined8 *)&(pMVar29->typeNames)._M_h._M_rehash_policy.field_0x4 = 0;
          (pMVar29->typeNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (pMVar29->typeNames)._M_h._M_element_count = 0;
          (pMVar29->typeNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          (pMVar29->typeIndices)._M_h._M_buckets = (__buckets_ptr)0x0;
          *(undefined2 *)&(pMVar29->typeIndices)._M_h._M_bucket_count = 0;
          _local_48 = (Function *)0x706d696c6167656c;
          local_40 = 0x2474726f;
          __dnew = 0xc;
          local_3c = 0;
          pPVar2 = ((Pass *)&local_a0->super_Importable)->runner;
          local_88.id = (uintptr_t)local_78;
          builder_1.wasm = pMVar29;
          _Stack_58._M_head_impl = (Export *)&stack0xffffffffffffffb8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,pPVar2,
                     (long)&pPVar2->_vptr_PassRunner +
                     (long)((Pass *)&local_a0->super_Importable)->_vptr_Pass);
          _Var37._M_head_impl = (Function *)0xf;
          if (_Stack_58._M_head_impl != (Export *)&stack0xffffffffffffffb8) {
            _Var37._M_head_impl = _local_48;
          }
          pFVar18 = (Function *)
                    ((long)&((builder.wasm)->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + __dnew);
          if (_Var37._M_head_impl < pFVar18) {
            in_R9.id = (uintptr_t)local_78;
            pFVar25 = (Function *)0xf;
            if (local_88.id != in_R9.id) {
              pFVar25 = (Function *)local_78._0_8_;
            }
            if (pFVar25 < pFVar18) goto LAB_0091ab89;
            puVar27 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_88,0,(char *)0x0,(ulong)_Stack_58._M_head_impl);
          }
          else {
LAB_0091ab89:
            puVar27 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&stack0xffffffffffffffa8,local_88.id);
          }
          auStack_248 = (undefined1  [8])
                        &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          puVar1 = puVar27 + 2;
          if ((pointer *)*puVar27 == (pointer *)puVar1) {
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)*puVar1;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)puVar27[3];
          }
          else {
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)*puVar1;
            auStack_248 = (undefined1  [8])*puVar27;
          }
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)puVar27[1];
          *puVar27 = puVar1;
          puVar27[1] = 0;
          *(undefined1 *)puVar1 = 0;
          s._M_str = (char *)0x0;
          s._M_len = (size_t)auStack_248;
          sVar49 = IString::interned((IString *)
                                     legalParams.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start,s,SUB81(puVar1,0));
          ((builder_1.wasm)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar49._M_len;
          ((builder_1.wasm)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar49._M_str;
          if (auStack_248 !=
              (undefined1  [8])
              &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete((void *)auStack_248,
                            (ulong)((long)&(legalParams.
                                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
          }
          if ((undefined1 *)local_88.id != local_78) {
            operator_delete((void *)local_88.id,
                            (ulong)((long)&(((Importable *)local_78._0_8_)->super_Named).name.
                                           super_IString.str._M_len + 1));
          }
          if (_Stack_58._M_head_impl != (Export *)&stack0xffffffffffffffb8) {
            operator_delete(_Stack_58._M_head_impl,(ulong)((long)_local_48 + 1));
          }
          puVar47 = (pointer)(((Pass *)&pFVar20->super_Importable)->name).field_2.
                             _M_allocated_capacity;
          ((builder_1.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(((Pass *)&pFVar20->super_Importable)->name)._M_string_length;
          ((builder_1.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar47;
          _Var10._M_p = (((Pass *)&pFVar20->super_Importable)->passArg).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          ((builder_1.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((long)&(((Pass *)&pFVar20->super_Importable)->name).field_2 + 8);
          ((builder_1.wasm)->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var10._M_p;
          *(undefined1 *)
           &((builder_1.wasm)->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
          __s = (mapped_type)operator_new(0x1d8);
          memset(__s,0,0x1d8);
          HeapType::HeapType(&__s->type,(Signature)ZEXT816(0));
          pFVar20 = local_a0;
          __s->profile = Normal;
          (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __s->body = (Expression *)0x0;
          (__s->localNames)._M_h._M_buckets = &(__s->localNames)._M_h._M_single_bucket;
          (__s->localNames)._M_h._M_bucket_count = 1;
          (__s->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (__s->localNames)._M_h._M_element_count = 0;
          (__s->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (__s->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
          (__s->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          (__s->localIndices)._M_h._M_buckets = &(__s->localIndices)._M_h._M_single_bucket;
          (__s->localIndices)._M_h._M_bucket_count = 1;
          (__s->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (__s->localIndices)._M_h._M_element_count = 0;
          (__s->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (__s->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
          (__s->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          (__s->debugLocations)._M_h._M_buckets = &(__s->debugLocations)._M_h._M_single_bucket;
          (__s->debugLocations)._M_h._M_bucket_count = 1;
          (__s->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (__s->debugLocations)._M_h._M_element_count = 0;
          (__s->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (__s->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
          (__s->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          (__s->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
          (__s->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
          (__s->expressionLocations)._M_h._M_buckets =
               &(__s->expressionLocations)._M_h._M_single_bucket;
          (__s->expressionLocations)._M_h._M_bucket_count = 1;
          (__s->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (__s->expressionLocations)._M_h._M_element_count = 0;
          (__s->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (__s->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
          (__s->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          (__s->delimiterLocations)._M_h._M_buckets =
               &(__s->delimiterLocations)._M_h._M_single_bucket;
          (__s->delimiterLocations)._M_h._M_bucket_count = 1;
          (__s->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (__s->delimiterLocations)._M_h._M_element_count = 0;
          (__s->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          *(undefined8 *)((long)&(__s->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
          (__s->funcLocation).declarations = 0;
          (__s->funcLocation).end = 0;
          (__s->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
          (__s->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          (__s->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          (__s->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          __s->noFullInline = false;
          __s->noPartialInline = false;
          _local_48 = (Function *)0x6e75666c6167656c;
          __dnew = 10;
          local_40 = CONCAT13(local_40._3_1_,0x2463);
          pPVar2 = ((Pass *)&local_a0->super_Importable)->runner;
          local_88.id = (uintptr_t)local_78;
          local_b0._M_head_impl = __s;
          _Stack_58._M_head_impl = (Export *)&stack0xffffffffffffffb8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,pPVar2,
                     (long)&pPVar2->_vptr_PassRunner +
                     (long)((Pass *)&local_a0->super_Importable)->_vptr_Pass);
          _Var37._M_head_impl = (Function *)0xf;
          if (_Stack_58._M_head_impl != (Export *)&stack0xffffffffffffffb8) {
            _Var37._M_head_impl = _local_48;
          }
          pFVar18 = (Function *)
                    ((long)&((builder.wasm)->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + __dnew);
          if (_Var37._M_head_impl < pFVar18) {
            in_R9.id = (uintptr_t)local_78;
            pFVar25 = (Function *)0xf;
            if (local_88.id != in_R9.id) {
              pFVar25 = (Function *)local_78._0_8_;
            }
            if (pFVar25 < pFVar18) goto LAB_0091ae3c;
            puVar27 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_88,0,(char *)0x0,(ulong)_Stack_58._M_head_impl);
          }
          else {
LAB_0091ae3c:
            puVar27 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&stack0xffffffffffffffa8,local_88.id);
          }
          auStack_248 = (undefined1  [8])
                        &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          puVar1 = puVar27 + 2;
          if ((pointer *)*puVar27 == (pointer *)puVar1) {
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)*puVar1;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)puVar27[3];
          }
          else {
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)*puVar1;
            auStack_248 = (undefined1  [8])*puVar27;
          }
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)puVar27[1];
          *puVar27 = puVar1;
          puVar27[1] = 0;
          *(undefined1 *)puVar1 = 0;
          s_00._M_str = (char *)0x0;
          s_00._M_len = (size_t)auStack_248;
          sVar49 = IString::interned((IString *)
                                     legalParams.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start,s_00,SUB81(puVar1,0));
          ((local_b0._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar49;
          if (auStack_248 !=
              (undefined1  [8])
              &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete((void *)auStack_248,
                            (ulong)((long)&(legalParams.
                                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
          }
          if ((undefined1 *)local_88.id != local_78) {
            operator_delete((void *)local_88.id,
                            (ulong)((long)&(((Importable *)local_78._0_8_)->super_Named).name.
                                           super_IString.str._M_len + 1));
          }
          if (_Stack_58._M_head_impl != (Export *)&stack0xffffffffffffffb8) {
            operator_delete(_Stack_58._M_head_impl,(ulong)((long)_local_48 + 1));
          }
          ((local_b0._M_head_impl)->type).id = (pFVar20->type).id;
          ((local_b0._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)MixedArena::allocSpace(pMVar43,0x48,8);
          pHVar41 = &pFVar20->type;
          *(undefined1 *)
           originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = 6;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[1] = (Function *)0x0;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[2] = (Function *)0x0;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[3] = (Function *)0x0;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[4] = (Function *)0x0;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[5] = (Function *)pMVar43;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[6] = (Function *)0x0;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[7] = (Function *)0x0;
          *(undefined1 *)
           (originalFunctions.
            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage + 8) = 0;
          pFVar20 = (Function *)
                    ((builder_1.wasm)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[6] =
               (Function *)
               ((builder_1.wasm)->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[7] = pFVar20;
          auStack_248 = (undefined1  [8])0x0;
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          SVar50 = HeapType::getSignature(pHVar41);
          local_88 = SVar50.params.id;
          __dnew = 0;
          _Stack_58._M_head_impl = (Export *)&local_88;
          sVar21 = wasm::Type::size(&local_88);
          if ((__dnew != sVar21) || (_Stack_58._M_head_impl != (Export *)&local_88)) {
            this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                      (originalFunctions.
                       super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 2);
            IVar17 = 0;
            do {
              pTVar22 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffa8);
              uVar3 = pTVar22->id;
              if (uVar3 == 3) {
                pEVar23 = I64Utilities::getI64Low((Builder *)&local_98,IVar17);
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          (this_00,pEVar23);
                pEVar23 = I64Utilities::getI64High((Builder *)&local_98,IVar17);
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          (this_00,pEVar23);
                local_108.id = 2;
                if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::
                  _M_realloc_insert<wasm::Type>
                            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_248,
                             (iterator)
                             legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_start,&local_108);
                }
                else {
                  (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start)->id = 2;
                  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1;
                }
                local_108.id = 2;
                if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::
                  _M_realloc_insert<wasm::Type>
                            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_248,
                             (iterator)
                             legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_start,&local_108);
                }
                else {
                  (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start)->id = 2;
LAB_0091b0e7:
                  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1;
                }
              }
              else {
                pEVar23 = (Expression *)
                          MixedArena::allocSpace((MixedArena *)(local_98.id + 0x200),0x18,8);
                pEVar23->_id = LocalGetId;
                *(Index *)(pEVar23 + 1) = IVar17;
                (pEVar23->type).id = uVar3;
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          (this_00,pEVar23);
                if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start)->id = pTVar22->id;
                  goto LAB_0091b0e7;
                }
                std::vector<wasm::Type,std::allocator<wasm::Type>>::
                _M_realloc_insert<wasm::Type_const&>
                          ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_248,
                           (iterator)
                           legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_start,pTVar22);
              }
              IVar17 = IVar17 + 1;
              __dnew = __dnew + 1;
            } while ((__dnew != sVar21) || (_Stack_58._M_head_impl != (Export *)&local_88));
          }
          SVar50 = HeapType::getSignature(pHVar41);
          pEVar23 = (Expression *)
                    originalFunctions.
                    super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          ppFVar44 = originalFunctions.
                     super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 1;
          if (SVar50.results.id.id == 3) {
            *ppFVar44 = (Function *)0x2;
            pFVar20 = *ppFVar28;
            if (pFVar20 == (Function *)0x0) {
              if (local_a8->exportedHelpers == true) {
                name_01.super_IString.str._M_str = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_EXPORTE_1;
                name_01.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_EXPORTE_0;
                pEVar24 = Module::getExport((Module *)local_78._24_8_,name_01);
                pcVar32 = (char *)0x0;
                sVar21 = 0;
                if (pEVar24->kind == Function) {
                  pvVar31 = &pEVar24->value;
                  if (*(__index_type *)
                       ((long)&(pEVar24->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) !=
                      '\0') {
                    pvVar31 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
                  }
                  sVar21 = *(size_t *)
                            &(pvVar31->super__Variant_base<wasm::Name,_wasm::HeapType>).
                             super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                             super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                             super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                             super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                             super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
                  pcVar32 = *(char **)((long)&(pvVar31->
                                              super__Variant_base<wasm::Name,_wasm::HeapType>).
                                              super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                              super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                              super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                              super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                              super__Variant_storage_alias<wasm::Name,_wasm::HeapType>
                                              ._M_u + 8);
                }
                name_02.super_IString.str._M_str = pcVar32;
                name_02.super_IString.str._M_len = sVar21;
                pFVar20 = Module::getFunction((Module *)local_78._24_8_,name_02);
              }
              else {
                name_06.super_IString.str._M_str = (char *)0x0;
                name_06.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_IMPORTE_1;
                pFVar20 = getFunctionOrImport((LegalizeJSInterface *)local_78._24_8_,
                                              _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_IMPORTE_0,name_06
                                              ,(Type)0x2,in_R9);
              }
              *ppFVar28 = pFVar20;
            }
            _Stack_58._M_head_impl = (Export *)0x0;
            __dnew = 0;
            _local_48 = (Function *)0x0;
            in_R9.id = 0;
            pCVar26 = Builder::makeCall((Builder *)&local_98,
                                        (Name)(pFVar20->super_Importable).super_Named.name.
                                              super_IString.str,
                                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                         *)&stack0xffffffffffffffa8,(Type)*ppFVar44,false);
            if (_Stack_58._M_head_impl != (Export *)0x0) {
              operator_delete(_Stack_58._M_head_impl,(long)_local_48 - (long)_Stack_58._M_head_impl)
              ;
            }
            pEVar23 = I64Utilities::recreateI64((Builder *)&local_98,pEVar23,(Expression *)pCVar26);
          }
          else {
            SVar50 = HeapType::getSignature(pHVar41);
            *ppFVar44 = (Function *)SVar50.results.id.id;
          }
          (local_b0._M_head_impl)->body = pEVar23;
          wasm::Type::Type(&local_88,(Tuple *)auStack_248);
          sig.results.id = (uintptr_t)*ppFVar44;
          sig.params.id = local_88.id;
          HeapType::HeapType((HeapType *)&stack0xffffffffffffffa8,sig);
          pMVar29 = (Module *)local_78._24_8_;
          _Var37._M_head_impl = local_b0._M_head_impl;
          ((builder_1.wasm)->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_58._M_head_impl;
          pFVar20 = Module::getFunctionOrNull
                              ((Module *)local_78._24_8_,
                               (Name)((local_b0._M_head_impl)->super_Importable).super_Named.name.
                                     super_IString.str);
          if (pFVar20 == (Function *)0x0) {
            Module::addFunction(pMVar29,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                         *)&local_b0);
          }
          pFVar20 = Module::getFunctionOrNull
                              (pMVar29,(IString)*(IString *)
                                                 &((builder_1.wasm)->exports).
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data);
          if (pFVar20 == (Function *)0x0) {
            Module::addFunction(pMVar29,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                         *)&builder_1);
          }
          if (auStack_248 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_248,
                            (long)legalParams.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)auStack_248);
          }
          if (local_b0._M_head_impl != (Function *)0x0) {
            std::default_delete<wasm::Function>::operator()
                      ((default_delete<wasm::Function> *)&local_b0,local_b0._M_head_impl);
          }
          if (builder_1.wasm != (Module *)0x0) {
            std::default_delete<wasm::Function>::operator()
                      ((default_delete<wasm::Function> *)&builder_1,(Function *)builder_1.wasm);
          }
          pFVar20 = local_a0;
          ppFVar30 = std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_02,(key_type *)local_a0);
          *ppFVar30 = _Var37._M_head_impl;
          _Var34._M_nxt = (_Hash_node_base *)local_100;
        }
        _Var34._M_nxt =
             (_Hash_node_base *)
             &(((vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                 *)_Var34._M_nxt)->
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
      } while (_Var34._M_nxt != (_Hash_node_base *)ppFVar13);
    }
  }
  pLVar14 = local_a8;
  if ((local_a8->illegalImportsToLegal)._M_h._M_element_count != 0) {
    local_120._8_8_ = &local_a8->illegalImportsToLegal;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_228;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228[0]._M_local_buf[0] = '\0';
    local_1f8 = false;
    local_1f0._0_8_ = (pointer)0x0;
    local_1f0._8_8_ = (Expression *)0x0;
    local_1f0._176_8_ = (pointer)0x0;
    local_1f0._184_8_ = 0;
    local_1f0._192_8_ = 0;
    pFStack_128 = (Function *)0x0;
    local_120._0_8_ = 0;
    auStack_248 = (undefined1  [8])&PTR__WalkerPass_01073680;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(local_a8->super_Pass).runner;
    WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_>::run
              ((WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_> *)auStack_248,
               pMVar29);
    pPVar2 = (pLVar14->super_Pass).runner;
    if ((PassRunner *)
        legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != pPVar2 &&
        legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                    ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
    }
    puVar5 = (pMVar29->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pPVar2;
    local_120._0_8_ = pMVar29;
    for (puVar45 = (pMVar29->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar45 != puVar5;
        puVar45 = puVar45 + 1) {
      pGVar6 = (puVar45->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar6->super_Importable).module + 8) == (char *)0x0) {
        Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk
                  ((Walker<Fixer,_wasm::Visitor<Fixer,_void>_> *)local_1f0,&pGVar6->init);
      }
    }
    pFVar20 = (Function *)
              (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 *)(local_78._24_8_ + 0x60))->
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (Function *)
               (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                  *)(local_78._24_8_ + 0x60))->
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar20 != local_a0) {
      do {
        pp_Var36 = ((Pass *)&pFVar20->super_Importable)->_vptr_Pass;
        if (pp_Var36[5] != (_func_int *)0x0) {
          Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk
                    ((Walker<Fixer,_wasm::Visitor<Fixer,_void>_> *)local_1f0,
                     (Expression **)(pp_Var36 + 5));
          pp_Var36 = ((Pass *)&pFVar20->super_Importable)->_vptr_Pass;
        }
        p_Var7 = (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> *)pp_Var36[8];
        for (p_Var39 = (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> *)
                       pp_Var36[7]; p_Var39 != p_Var7; p_Var39 = p_Var39 + 1) {
          _Stack_58._M_head_impl = *(Export **)&p_Var39->_M_t;
          Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk
                    ((Walker<Fixer,_wasm::Visitor<Fixer,_void>_> *)local_1f0,
                     (Expression **)&stack0xffffffffffffffa8);
        }
        pFVar20 = (Function *)&((Pass *)&pFVar20->super_Importable)->runner;
      } while (pFVar20 != local_a0);
    }
    puVar8 = (((vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                *)(local_78._24_8_ + 0x90))->
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (puVar46 = (((vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                      *)(local_78._24_8_ + 0x90))->
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pMVar29 = (Module *)local_78._24_8_,
        puVar46 != puVar8; puVar46 = puVar46 + 1) {
      _Var9._M_head_impl =
           (puVar46->_M_t).
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
           super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if ((_Var9._M_head_impl)->offset != (Expression *)0x0) {
        Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk
                  ((Walker<Fixer,_wasm::Visitor<Fixer,_void>_> *)local_1f0,
                   &(_Var9._M_head_impl)->offset);
      }
    }
    local_120._0_8_ = 0;
    p_Var35 = &(local_a8->illegalImportsToLegal)._M_h._M_before_begin;
    while (p_Var35 = p_Var35->_M_nxt, p_Var35 != (__node_base *)0x0) {
      Module::removeFunction(pMVar29,(Name)*(string_view *)(p_Var35 + 1));
    }
    if ((pointer)local_1f0._176_8_ != (pointer)0x0) {
      operator_delete((void *)local_1f0._176_8_,local_1f0._192_8_ - local_1f0._176_8_);
    }
    Pass::~Pass((Pass *)auStack_248);
  }
  name_03.super_IString.str._M_str = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_EXPORTE_1;
  name_03.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_EXPORTE_0;
  Module::removeExport(pMVar29,name_03);
  name_04.super_IString.str._M_str = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_EXPORTE_1;
  name_04.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_EXPORTE_0;
  Module::removeExport(pMVar29,name_04);
  if ((vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
       *)_Stack_f8._M_nxt !=
      (vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
       *)0x0) {
    operator_delete(_Stack_f8._M_nxt,
                    (long)originalFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)_Stack_f8._M_nxt);
  }
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::~vector((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             *)auStack_268);
  return;
}

Assistant:

void run(Module* module) override {
    setTempRet0 = nullptr;
    getTempRet0 = nullptr;
    auto exportOriginals =
      hasArgument("legalize-js-interface-export-originals");
    exportedHelpers = hasArgument("legalize-js-interface-exported-helpers");
    // for each illegal export, we must export a legalized stub instead
    std::vector<std::unique_ptr<Export>> newExports;
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function) {
        // if it's an import, ignore it
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        if (isIllegal(func)) {
          // Provide a legal function for the export.
          auto legalName = makeLegalStub(func, module);
          *name = legalName;
          if (exportOriginals) {
            // Also export the original function, before legalization. This is
            // not normally useful for JS, except in cases like dynamic linking
            // where the JS loader code must copy exported wasm functions into
            // the table, and they must not be legalized as other wasm code will
            // do an indirect call to them. However, don't do this for imported
            // functions, as those would be legalized in their actual module
            // anyhow. It also makes no sense to do this for dynCalls, as they
            // are only called from JS.
            if (!func->imported() && !isDynCall(ex->name)) {
              Builder builder(*module);
              Name newName = std::string("orig$") + ex->name.toString();
              newExports.push_back(builder.makeExport(
                newName, func->name, ExternalKind::Function));
            }
          }
        }
      }
    }

    for (auto& ex : newExports) {
      module->addExport(std::move(ex));
    }
    // Avoid iterator invalidation later.
    std::vector<Function*> originalFunctions;
    for (auto& func : module->functions) {
      originalFunctions.push_back(func.get());
    }
    // for each illegal import, we must call a legalized stub instead
    for (auto* im : originalFunctions) {
      if (im->imported() && isIllegal(im)) {
        auto* func = makeLegalStubForCalledImport(im, module);
        illegalImportsToLegal[im->name] = func;
      }
    }

    if (!illegalImportsToLegal.empty()) {
      // fix up imports: call of an illegal import must be turned to a call of a
      // legal import. the same must be done with ref.funcs.
      struct Fixer : public WalkerPass<PostWalker<Fixer>> {
        bool isFunctionParallel() override { return true; }

        std::unique_ptr<Pass> create() override {
          return std::make_unique<Fixer>(illegalImportsToLegal);
        }

        std::unordered_map<Name, Function*>& illegalImportsToLegal;

        Fixer(std::unordered_map<Name, Function*>& illegalImportsToLegal)
          : illegalImportsToLegal(illegalImportsToLegal) {}

        void visitCall(Call* curr) {
          auto iter = illegalImportsToLegal.find(curr->target);
          if (iter == illegalImportsToLegal.end()) {
            return;
          }

          replaceCurrent(Builder(*getModule())
                           .makeCall(iter->second->name,
                                     curr->operands,
                                     curr->type,
                                     curr->isReturn));
        }

        void visitRefFunc(RefFunc* curr) {
          auto iter = illegalImportsToLegal.find(curr->func);
          if (iter == illegalImportsToLegal.end()) {
            return;
          }

          curr->func = iter->second->name;
          // TODO: Make this exact.
          curr->type = Type(iter->second->type, NonNullable);
        }
      };

      Fixer fixer(illegalImportsToLegal);
      fixer.run(getPassRunner(), module);
      fixer.runOnModuleCode(getPassRunner(), module);

      // Finally we can remove all the now-unused illegal imports
      for (const auto& pair : illegalImportsToLegal) {
        module->removeFunction(pair.first);
      }
    }

    module->removeExport(GET_TEMP_RET_EXPORT);
    module->removeExport(SET_TEMP_RET_EXPORT);
  }